

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testStringVectorHelper(exr_context_t f)

{
  exr_attr_string_t *peVar1;
  exr_result_t eVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  char *in_RCX;
  char *pcVar6;
  _internal_exr_context *pctxt;
  exr_attr_string_vector_t sv;
  exr_attr_string_vector_t sv2;
  exr_attr_string_vector_t nil;
  
  nil.n_strings = 0;
  nil.alloc_size = 0;
  nil.strings = (exr_attr_string_t *)0x0;
  eVar2 = exr_attr_string_vector_init(f,(exr_attr_string_vector_t *)0x0,4);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar6);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init (f, __null, 4)",(char *)0x12c,0x151a58,in_RCX);
  }
  if (f == (exr_context_t)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, __null)",(char *)0x12d,0x151a58,in_RCX);
  }
  eVar2 = exr_attr_string_vector_destroy(f,&nil);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, &nil)",(char *)0x12e,0x151a58,in_RCX);
  }
  eVar2 = exr_attr_string_vector_init(f,&sv,-4);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar6);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init (f, &sv, -4)",(char *)0x130,0x151a58,in_RCX);
  }
  eVar2 = exr_attr_string_vector_init(f,&sv,0x3fffffff);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar6);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init (f, &sv, (2147483647) / 2)",(char *)0x133,0x151a58,
                   in_RCX);
  }
  s_malloc_fail_on = 1;
  eVar2 = exr_attr_string_vector_init(f,&sv,1);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar6);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message(1);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init (f, &sv, 1)",(char *)0x135,0x151a58,in_RCX);
  }
  pcVar6 = (char *)0x0;
  iVar3 = (**(code **)(f + 0x48))
                    (f,3,"Invalid reference to string vector object to initialize index %d");
  if (iVar3 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init_entry (f, __null, 0, 3)",(char *)0x139,0x151a58,
                   pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_init_entry(f,&nil,0,3);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init_entry (f, &nil, 0, 3)",(char *)0x13c,0x151a58,pcVar6
                  );
  }
  eVar2 = exr_attr_string_vector_init(f,&sv,1);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init (f, &sv, 1)",(char *)0x141,0x151a58,pcVar6);
  }
  if (sv.n_strings != 1) {
    core_test_fail("sv.n_strings == 1",(char *)0x142,0x151a58,pcVar6);
  }
  if (sv.alloc_size != 1) {
    core_test_fail("sv.alloc_size == 1",(char *)0x143,0x151a58,pcVar6);
  }
  if (sv.strings == (exr_attr_string_t *)0x0) {
    core_test_fail("sv.strings != __null",(char *)0x144,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0xffffffffffffffff;
  iVar3 = (**(code **)(f + 0x48))
                    (f,3,"Invalid index (%d of %d) initializing string vector",0xffffffffffffffff,1)
  ;
  if (iVar3 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init_entry (f, &sv, -1, 3)",(char *)0x148,0x151a58,pcVar6
                  );
  }
  pcVar6 = (char *)0xfffffffffffffffd;
  eVar2 = exr_attr_string_vector_init_entry(f,&sv,0,-3);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init_entry (f, &sv, 0, -3)",(char *)0x14b,0x151a58,pcVar6
                  );
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_init_entry(f,&sv,1,3);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_init_entry (f, &sv, 1, 3)",(char *)0x14e,0x151a58,pcVar6)
    ;
  }
  pcVar6 = (char *)0x0;
  eVar2 = exr_attr_string_vector_set_entry_with_length(f,&sv,-1,(char *)0x0,-1);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, -1, __null, -1)",
                   (char *)0x152,0x151a58,pcVar6);
  }
  pcVar6 = "exr";
  eVar2 = exr_attr_string_vector_set_entry_with_length(f,&sv,-1,"exr",3);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, -1, \"exr\", 3)",
                   (char *)0x155,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x0;
  eVar2 = exr_attr_string_vector_set_entry_with_length(f,&sv,0,(char *)0x0,-1);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, 0, __null, -1)",
                   (char *)0x158,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x0;
  eVar2 = exr_attr_string_vector_set_entry_with_length(f,&sv,1,(char *)0x0,-1);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, 1, __null, -1)",
                   (char *)0x15b,0x151a58,pcVar6);
  }
  iVar3 = (**(code **)(f + 0x40))(f,3,"Invalid reference to string vector object to assign to");
  if (iVar3 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, __null, 1, __null, -1)",
                   (char *)0x161,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x0;
  eVar2 = exr_attr_string_vector_set_entry(f,&sv,0,(char *)0x0);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry (f, &sv, 0, __null)",(char *)0x163,0x151a58,
                   pcVar6);
  }
  if ((sv.strings)->length != 0) {
    core_test_fail("sv.strings[0].length == 0",(char *)0x164,0x151a58,pcVar6);
  }
  if ((sv.strings)->alloc_size != 1) {
    core_test_fail("sv.strings[0].alloc_size == 1",(char *)0x165,0x151a58,pcVar6);
  }
  if (*(sv.strings)->str != '\0') {
    core_test_fail("sv.strings[0].str[0] == \'\\0\'",(char *)0x166,0x151a58,pcVar6);
  }
  pcVar6 = "exr";
  eVar2 = exr_attr_string_vector_set_entry(f,&sv,0,"exr");
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_set_entry (f, &sv, 0, \"exr\")",(char *)0x167,0x151a58,
                   pcVar6);
  }
  if ((sv.strings)->length != 3) {
    core_test_fail("sv.strings[0].length == 3",(char *)0x168,0x151a58,pcVar6);
  }
  if ((sv.strings)->alloc_size != 4) {
    core_test_fail("sv.strings[0].alloc_size == 4",(char *)0x169,0x151a58,pcVar6);
  }
  iVar3 = strcmp((sv.strings)->str,"exr");
  if (iVar3 != 0) {
    core_test_fail("0 == strcmp (sv.strings[0].str, \"exr\")",(char *)0x16a,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_add_entry(f,&sv,"openexr");
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry (f, &sv, \"openexr\")",(char *)0x16c,0x151a58,
                   pcVar6);
  }
  if (sv.n_strings != 2) {
    core_test_fail("sv.n_strings == 2",(char *)0x16d,0x151a58,pcVar6);
  }
  if (sv.alloc_size != 2) {
    core_test_fail("sv.alloc_size == 2",(char *)0x16e,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,(exr_attr_string_vector_t *)0x0,"foo",3);
  peVar1 = sv.strings;
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, __null, \"foo\", 3)",
                   (char *)0x175,0x151a58,pcVar6);
  }
  if ((sv.strings)->length != 3) {
    core_test_fail("sv.strings[0].length == 3",(char *)0x176,0x151a58,pcVar6);
  }
  if ((sv.strings)->alloc_size != 4) {
    core_test_fail("sv.strings[0].alloc_size == 4",(char *)0x177,0x151a58,pcVar6);
  }
  iVar3 = strcmp((sv.strings)->str,"exr");
  if (iVar3 != 0) {
    core_test_fail("0 == strcmp (sv.strings[0].str, \"exr\")",(char *)0x178,0x151a58,pcVar6);
  }
  if (peVar1[1].length != 7) {
    core_test_fail("sv.strings[1].length == 7",(char *)0x179,0x151a58,pcVar6);
  }
  if (peVar1[1].alloc_size != 8) {
    core_test_fail("sv.strings[1].alloc_size == 8",(char *)0x17a,0x151a58,pcVar6);
  }
  iVar3 = strcmp(peVar1[1].str,"openexr");
  if (iVar3 != 0) {
    core_test_fail("0 == strcmp (sv.strings[1].str, \"openexr\")",(char *)0x17b,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_copy((exr_context_t)0x0,&sv2,&sv);
  if (eVar2 != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_copy (__null, &sv2, &sv)",(char *)0x17f,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_copy(f,(exr_attr_string_vector_t *)0x0,&sv);
  if (eVar2 != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_copy (f, __null, &sv)",(char *)0x183,0x151a58,pcVar6);
  }
  s_malloc_fail_on = 1;
  eVar2 = exr_attr_string_vector_copy(f,&sv2,&sv);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_copy (f, &sv2, &sv)",(char *)0x185,0x151a58,pcVar6);
  }
  s_malloc_fail_on = 2;
  eVar2 = exr_attr_string_vector_copy(f,&sv2,&sv);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_copy (f, &sv2, &sv)",(char *)0x187,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_destroy(f,&sv2);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, &sv2)",(char *)0x188,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_copy(f,&sv2,&sv);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_copy (f, &sv2, &sv)",(char *)0x189,0x151a58,pcVar6);
  }
  if (sv2.n_strings != 2) {
    core_test_fail("sv2.n_strings == 2",(char *)0x18a,0x151a58,pcVar6);
  }
  if (sv2.alloc_size != 2) {
    core_test_fail("sv2.alloc_size == 2",(char *)0x18b,0x151a58,pcVar6);
  }
  if ((sv2.strings)->length != 3) {
    core_test_fail("sv2.strings[0].length == 3",(char *)0x18d,0x151a58,pcVar6);
  }
  if ((sv2.strings)->alloc_size != 4) {
    core_test_fail("sv2.strings[0].alloc_size == 4",(char *)0x18e,0x151a58,pcVar6);
  }
  iVar3 = strcmp((sv2.strings)->str,"exr");
  if (iVar3 != 0) {
    core_test_fail("0 == strcmp (sv2.strings[0].str, \"exr\")",(char *)0x18f,0x151a58,pcVar6);
  }
  if (sv2.strings[1].length != 7) {
    core_test_fail("sv2.strings[1].length == 7",(char *)0x190,0x151a58,pcVar6);
  }
  if (sv2.strings[1].alloc_size != 8) {
    core_test_fail("sv2.strings[1].alloc_size == 8",(char *)0x191,0x151a58,pcVar6);
  }
  iVar3 = strcmp(sv2.strings[1].str,"openexr");
  if (iVar3 != 0) {
    core_test_fail("0 == strcmp (sv2.strings[1].str, \"openexr\")",(char *)0x192,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_destroy(f,&sv2);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, &sv2)",(char *)0x193,0x151a58,pcVar6);
  }
  sv2.n_strings = 0;
  sv2.alloc_size = 0;
  sv2.strings = (exr_attr_string_t *)0x0;
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv2,"foo",3);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"foo\", 3)",
                   (char *)0x196,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv2,"bar",3);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"bar\", 3)",
                   (char *)0x198,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv2,"baz",3);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"baz\", 3)",
                   (char *)0x19a,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x4;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv2,"frob",4);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"frob\", 4)",
                   (char *)0x19c,0x151a58,pcVar6);
  }
  pcVar6 = (char *)0x4;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv2,"nitz",4);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"nitz\", 4)",
                   (char *)0x19e,0x151a58,pcVar6);
  }
  if (sv2.n_strings != 5) {
    core_test_fail("sv2.n_strings == 5",(char *)0x19f,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_destroy(f,&sv2);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, &sv2)",(char *)0x1a0,0x151a58,pcVar6);
  }
  sv2.n_strings = 0;
  sv2.alloc_size = 0;
  sv2.strings = (exr_attr_string_t *)0x0;
  s_malloc_fail_on = 1;
  pcVar6 = (char *)0x3;
  eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv2,"foo",3);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"foo\", 3)",
                   (char *)0x1a4,0x151a58,pcVar6);
  }
  eVar2 = exr_attr_string_vector_destroy(f,&sv);
  if (eVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, &sv)",(char *)0x1a6,0x151a58,pcVar6);
  }
  if (sv.n_strings != 0) {
    core_test_fail("sv.n_strings == 0",(char *)0x1a7,0x151a58,pcVar6);
  }
  if (sv.alloc_size == 0) {
    if (sv.strings != (exr_attr_string_t *)0x0) {
      core_test_fail("sv.strings == __null",(char *)0x1a9,0x151a58,pcVar6);
    }
    eVar2 = exr_attr_string_vector_destroy(f,&sv);
    if (eVar2 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar5 = (char *)exr_get_default_error_message(eVar2);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_attr_string_vector_destroy (f, &sv)",(char *)0x1ab,0x151a58,pcVar6);
    }
    eVar2 = exr_attr_string_vector_init(f,&sv,0x7ffffff);
    if (eVar2 == 0) {
      pcVar6 = (char *)0x3;
      eVar2 = exr_attr_string_vector_add_entry_with_length(f,&sv,"exr",3);
      if (eVar2 != 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar2);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\n    expected: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar5 = (char *)exr_get_default_error_message(1);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv, \"exr\", 3)",
                       (char *)0x1b4,0x151a58,pcVar6);
      }
    }
    eVar2 = exr_attr_string_vector_destroy(f,&sv);
    if (eVar2 == 0) {
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(eVar2);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_attr_string_vector_destroy (f, &sv)",(char *)0x1b6,0x151a58,pcVar6);
  }
  core_test_fail("sv.alloc_size == 0",(char *)0x1a8,0x151a58,pcVar6);
}

Assistant:

static void
testStringVectorHelper (exr_context_t f)
{
    // TODO: Find a good way to test adding until we grow past the memory limit (i.e. INT32_MAX/2 entries)
    exr_attr_string_vector_t sv, nil = {0};
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_init (NULL, &sv, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_destroy (NULL, &sv));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_init (f, NULL, 4));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, NULL));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &nil));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_init (f, &sv, -4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init (f, &sv, INT32_MAX / 2));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_init (f, &sv, 1));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, NULL, 0, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &nil, 0, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_init_entry (NULL, &nil, 0, 3));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv, 1));
    EXRCORE_TEST (sv.n_strings == 1);
    EXRCORE_TEST (sv.alloc_size == 1);
    EXRCORE_TEST (sv.strings != NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, -1, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, 0, -3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, 1, 3));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, -1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, -1, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, 0, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, 1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_set_entry_with_length (NULL, &sv, 1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, NULL, 1, NULL, -1));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_set_entry (f, &sv, 0, NULL));
    EXRCORE_TEST (sv.strings[0].length == 0);
    EXRCORE_TEST (sv.strings[0].alloc_size == 1);
    EXRCORE_TEST (sv.strings[0].str[0] == '\0');
    EXRCORE_TEST_RVAL (exr_attr_string_vector_set_entry (f, &sv, 0, "exr"));
    EXRCORE_TEST (sv.strings[0].length == 3);
    EXRCORE_TEST (sv.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv.strings[0].str, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_add_entry (f, &sv, "openexr"));
    EXRCORE_TEST (sv.n_strings == 2);
    EXRCORE_TEST (sv.alloc_size == 2);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_add_entry_with_length (NULL, &sv, "foo", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_add_entry_with_length (f, NULL, "foo", 3));
    EXRCORE_TEST (sv.strings[0].length == 3);
    EXRCORE_TEST (sv.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv.strings[0].str, "exr"));
    EXRCORE_TEST (sv.strings[1].length == 7);
    EXRCORE_TEST (sv.strings[1].alloc_size == 8);
    EXRCORE_TEST (0 == strcmp (sv.strings[1].str, "openexr"));
    exr_attr_string_vector_t sv2;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_copy (NULL, &sv2, &sv));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_copy (f, &sv2, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_copy (f, NULL, &sv));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1, EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST (sv2.n_strings == 2);
    EXRCORE_TEST (sv2.alloc_size == 2);

    EXRCORE_TEST (sv2.strings[0].length == 3);
    EXRCORE_TEST (sv2.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv2.strings[0].str, "exr"));
    EXRCORE_TEST (sv2.strings[1].length == 7);
    EXRCORE_TEST (sv2.strings[1].alloc_size == 8);
    EXRCORE_TEST (0 == strcmp (sv2.strings[1].str, "openexr"));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv2, 0));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "foo", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "bar", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "baz", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "frob", 4));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "nitz", 4));
    EXRCORE_TEST (sv2.n_strings == 5);
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv2, 0));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "foo", 3));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));
    EXRCORE_TEST (sv.n_strings == 0);
    EXRCORE_TEST (sv.alloc_size == 0);
    EXRCORE_TEST (sv.strings == NULL);
    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));

    // might be on a low memory machine, in which case just skip the test
    if (EXR_ERR_SUCCESS ==
        exr_attr_string_vector_init (
            f, &sv, (int) (INT32_MAX / (int) sizeof (exr_attr_string_t))))
    {
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_OUT_OF_MEMORY,
            exr_attr_string_vector_add_entry_with_length (f, &sv, "exr", 3));
    }
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));
}